

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall duckdb::MD5Context::Finish(MD5Context *this,data_ptr_t out_digest)

{
  uchar *in;
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = this->bits[0] >> 3 & 0x3f;
  in = this->in;
  this->in[uVar2] = 0x80;
  if ((uVar2 ^ 0x3f) < 8) {
    switchD_00570541::default(this->in + (ulong)uVar2 + 1,0,(ulong)(uVar2 ^ 0x3f));
    iVar3 = 6;
    do {
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x16);
    MD5Transform(this->buf,(uint32_t *)in);
    this->in[0x20] = '\0';
    this->in[0x21] = '\0';
    this->in[0x22] = '\0';
    this->in[0x23] = '\0';
    this->in[0x24] = '\0';
    this->in[0x25] = '\0';
    this->in[0x26] = '\0';
    this->in[0x27] = '\0';
    this->in[0x28] = '\0';
    this->in[0x29] = '\0';
    this->in[0x2a] = '\0';
    this->in[0x2b] = '\0';
    this->in[0x2c] = '\0';
    this->in[0x2d] = '\0';
    this->in[0x2e] = '\0';
    this->in[0x2f] = '\0';
    this->in[0x10] = '\0';
    this->in[0x11] = '\0';
    this->in[0x12] = '\0';
    this->in[0x13] = '\0';
    this->in[0x14] = '\0';
    this->in[0x15] = '\0';
    this->in[0x16] = '\0';
    this->in[0x17] = '\0';
    this->in[0x18] = '\0';
    this->in[0x19] = '\0';
    this->in[0x1a] = '\0';
    this->in[0x1b] = '\0';
    this->in[0x1c] = '\0';
    this->in[0x1d] = '\0';
    this->in[0x1e] = '\0';
    this->in[0x1f] = '\0';
    in[0] = '\0';
    in[1] = '\0';
    in[2] = '\0';
    in[3] = '\0';
    in[4] = '\0';
    in[5] = '\0';
    in[6] = '\0';
    in[7] = '\0';
    this->in[8] = '\0';
    this->in[9] = '\0';
    this->in[10] = '\0';
    this->in[0xb] = '\0';
    this->in[0xc] = '\0';
    this->in[0xd] = '\0';
    this->in[0xe] = '\0';
    this->in[0xf] = '\0';
    this->in[0x30] = '\0';
    this->in[0x31] = '\0';
    this->in[0x32] = '\0';
    this->in[0x33] = '\0';
    this->in[0x34] = '\0';
    this->in[0x35] = '\0';
    this->in[0x36] = '\0';
    this->in[0x37] = '\0';
  }
  else {
    switchD_00570541::default(this->in + (ulong)uVar2 + 1,0,(ulong)(0x37 - uVar2));
  }
  iVar3 = 6;
  do {
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x14);
  *(undefined8 *)(this->in + 0x38) = *(undefined8 *)this->bits;
  MD5Transform(this->buf,(uint32_t *)in);
  iVar3 = 0;
  do {
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  uVar1 = *(undefined8 *)(this->buf + 2);
  *(undefined8 *)out_digest = *(undefined8 *)this->buf;
  *(undefined8 *)(out_digest + 8) = uVar1;
  return;
}

Assistant:

void MD5Context::Finish(data_ptr_t out_digest) {
	unsigned count;
	unsigned char *p;

	/* Compute number of bytes mod 64 */
	count = (bits[0] >> 3) & 0x3F;

	/* Set the first char of padding to 0x80.  This is safe since there is
	   always at least one byte free */
	p = in + count;
	*p++ = 0x80;

	/* Bytes of padding needed to make 64 bytes */
	count = 64 - 1 - count;

	/* Pad out to 56 mod 64 */
	if (count < 8) {
		/* Two lots of padding:  Pad the first block to 64 bytes */
		memset(p, 0, count);
		ByteReverse(in, 16);
		MD5Transform(buf, reinterpret_cast<uint32_t *>(in));

		/* Now fill the next block with 56 bytes */
		memset(in, 0, 56);
	} else {
		/* Pad block to 56 bytes */
		memset(p, 0, count - 8);
	}
	ByteReverse(in, 14);

	/* Append length in bits and transform */
	(reinterpret_cast<uint32_t *>(in))[14] = bits[0];
	(reinterpret_cast<uint32_t *>(in))[15] = bits[1];

	MD5Transform(buf, reinterpret_cast<uint32_t *>(in));
	ByteReverse(reinterpret_cast<unsigned char *>(buf), 4);
	memcpy(out_digest, buf, 16);
}